

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfoMB * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  PrimRefMB *pPVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  ulong uVar19;
  uint uVar20;
  unsigned_long uVar21;
  size_t *psVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar51;
  undefined1 auVar50 [16];
  float fVar57;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar58;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar70;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar71;
  undefined1 auVar72 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar73;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar74;
  undefined1 auVar75 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar76;
  undefined1 auVar77 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar78;
  undefined1 auVar79 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  ulong local_218;
  unsigned_long local_1f0;
  size_t local_1e8;
  size_t local_1e0;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  ulong local_190;
  anon_class_16_2_07cfa4d6 local_188;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_178;
  undefined1 local_168 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  float local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined1 local_108 [16];
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar26 = r->_begin;
  uVar21 = r->_end;
  if (uVar26 < uVar21) {
    auVar64 = ZEXT464(0x3f800000);
    local_118 = 1.0;
    uStack_114 = 0;
    uStack_110 = 0;
    uStack_10c = 0;
    auVar30 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
    auVar80 = ZEXT1664(auVar30);
    auVar31._8_4_ = 0xff800000;
    auVar31._0_8_ = 0xff800000ff800000;
    auVar31._12_4_ = 0xff800000;
    auVar68 = ZEXT1664(auVar31);
    auVar32._8_4_ = 0x7f800000;
    auVar32._0_8_ = 0x7f8000007f800000;
    auVar32._12_4_ = 0x7f800000;
    auVar69 = ZEXT1664(auVar32);
    local_1f0 = 0;
    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar81 = ZEXT1664(auVar30);
    auVar30 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
    auVar82 = ZEXT1664(auVar30);
    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
    auVar83 = ZEXT1664(auVar30);
    auVar79 = ZEXT1664(auVar32);
    auVar77 = ZEXT1664(auVar31);
    auVar72 = ZEXT1664(auVar32);
    auVar75 = ZEXT1664(auVar31);
    local_1e8 = 0;
    local_218 = 0;
    local_f8 = 0.0;
    uStack_f4 = 0;
    uStack_f0 = 0;
    uStack_ec = 0;
    local_1e0 = k;
    do {
      BVar2 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      auVar30._8_8_ = 0;
      auVar30._0_4_ = BVar2.lower;
      auVar30._4_4_ = BVar2.upper;
      auVar30 = vmovshdup_avx(auVar30);
      fVar34 = BVar2.lower;
      fVar35 = auVar30._0_4_ - fVar34;
      auVar33._0_4_ = (t0t1->lower - fVar34) / fVar35;
      auVar33._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar30 = vmulss_avx512f(auVar33,SUB6416(ZEXT464(0x3f800002),0));
      auVar31 = vmulss_avx512f(ZEXT416((uint)((t0t1->upper - fVar34) / fVar35)),
                               SUB6416(ZEXT464(0x3f7ffffc),0));
      uVar15 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar26);
      uVar16 = (ulong)(uVar15 + 3);
      pBVar3 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
               vertices.items;
      if (uVar16 < (pBVar3->super_RawBufferView).num) {
        fVar1 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                super_Geometry.fnumTimeSegments;
        auVar30 = ZEXT416((uint)(fVar1 * auVar30._0_4_));
        auVar30 = vroundss_avx(auVar30,auVar30,9);
        auVar32 = vmaxss_avx512f(auVar80._0_16_,auVar30);
        auVar30 = ZEXT416((uint)(fVar1 * auVar31._0_4_));
        auVar30 = vroundss_avx(auVar30,auVar30,10);
        auVar30 = vminss_avx(auVar30,ZEXT416((uint)fVar1));
        uVar20 = (uint)auVar30._0_4_;
        if ((uint)(int)auVar32._0_4_ <= uVar20) {
          uVar19 = (ulong)(int)auVar32._0_4_;
          psVar22 = &pBVar3[uVar19].super_RawBufferView.stride;
          bVar29 = psVar22 == (size_t *)0x0;
          do {
            pcVar4 = ((RawBufferView *)(psVar22 + -2))->ptr_ofs;
            sVar18 = *psVar22;
            lVar25 = sVar18 * uVar15;
            auVar31 = auVar81._0_16_;
            auVar30 = vandps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar25 + 0xc)),auVar31);
            vucomiss_avx512f(auVar30);
            if (SEXT816(lVar25) != SEXT816((long)sVar18) * SEXT816((long)(ulong)uVar15) || bVar29)
            goto LAB_01ede186;
            lVar24 = sVar18 * (uVar15 + 1);
            auVar30 = vandps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar24 + 0xc)),auVar31);
            vucomiss_avx512f(auVar30);
            if (SEXT816(lVar24) != SEXT816((long)sVar18) * SEXT816((long)(ulong)(uVar15 + 1)) ||
                bVar29) goto LAB_01ede186;
            lVar28 = sVar18 * (uVar15 + 2);
            auVar30 = vandps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar28 + 0xc)),auVar31);
            vucomiss_avx512f(auVar30);
            if (SEXT816(lVar28) != SEXT816((long)sVar18) * SEXT816((long)(ulong)(uVar15 + 2)) ||
                bVar29) goto LAB_01ede186;
            lVar17 = sVar18 * uVar16;
            auVar30 = vandps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar17 + 0xc)),auVar31);
            vucomiss_avx512f(auVar30);
            if (SEXT816(lVar17) != SEXT816((long)sVar18) * SEXT816((long)uVar16) || bVar29)
            goto LAB_01ede186;
            auVar30 = auVar82._0_16_;
            uVar13 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar25),auVar30,6);
            auVar31 = auVar83._0_16_;
            uVar14 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar25),auVar31,1);
            if ((~((ushort)uVar13 & (ushort)uVar14) & 7) != 0) goto LAB_01ede186;
            uVar13 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar24),auVar30,6);
            uVar14 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar24),auVar31,1);
            if ((~((ushort)uVar13 & (ushort)uVar14) & 7) != 0) goto LAB_01ede186;
            uVar13 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar28),auVar30,6);
            uVar14 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar28),auVar31,1);
            if ((~((ushort)uVar13 & (ushort)uVar14) & 7) != 0) goto LAB_01ede186;
            uVar13 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar17),auVar30,6);
            uVar14 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar17),auVar31,1);
            if ((~((ushort)uVar13 & (ushort)uVar14) & 7) != 0) goto LAB_01ede186;
            uVar19 = uVar19 + 1;
            psVar22 = psVar22 + 7;
            bVar29 = uVar19 == (long)(int)uVar20;
          } while (uVar19 <= (ulong)(long)(int)uVar20);
        }
        local_138 = auVar79._0_16_;
        local_128 = auVar77._0_16_;
        local_108 = auVar75._0_16_;
        local_e8 = auVar72._0_16_;
        local_d8 = auVar69._0_16_;
        local_c8 = auVar68._0_16_;
        local_b8 = auVar64._0_16_;
        local_188.primID = &local_190;
        fVar41 = (t0t1->lower - fVar34) / fVar35;
        fVar35 = (t0t1->upper - fVar34) / fVar35;
        fVar34 = fVar1 * fVar41;
        fVar37 = fVar1 * fVar35;
        auVar31 = vroundss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34),9);
        auVar32 = vroundss_avx(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37),10);
        auVar33 = vmaxss_avx512f(auVar31,auVar80._0_16_);
        auVar30 = vminss_avx(auVar32,ZEXT416((uint)fVar1));
        iVar23 = (int)auVar33._0_4_;
        fVar46 = auVar30._0_4_;
        uVar15 = (int)auVar31._0_4_;
        if ((int)auVar31._0_4_ < 0) {
          uVar15 = 0xffffffff;
        }
        iVar27 = (int)fVar1 + 1;
        if ((int)auVar32._0_4_ < (int)fVar1 + 1) {
          iVar27 = (int)auVar32._0_4_;
        }
        local_190 = uVar26;
        local_188.this = this;
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_158.field_1,&local_188,(long)iVar23);
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_178.field_1,&local_188,(long)(int)fVar46);
        auVar30 = auVar80._0_16_;
        fVar34 = fVar34 - auVar33._0_4_;
        if (iVar27 - uVar15 == 1) {
          auVar31 = vmaxss_avx(ZEXT416((uint)fVar34),ZEXT816(0) << 0x40);
          fVar34 = auVar31._0_4_;
          fVar35 = 1.0 - fVar34;
          auVar60._0_4_ = fVar34 * local_178.m128[0];
          auVar60._4_4_ = fVar34 * local_178.m128[1];
          auVar60._8_4_ = fVar34 * local_178.m128[2];
          auVar60._12_4_ = fVar34 * local_178.m128[3];
          auVar42._4_4_ = fVar35;
          auVar42._0_4_ = fVar35;
          auVar42._8_4_ = fVar35;
          auVar42._12_4_ = fVar35;
          auVar62 = vfmadd231ps_fma(auVar60,auVar42,(undefined1  [16])local_158);
          auVar65._0_4_ = fVar34 * local_168._0_4_;
          auVar65._4_4_ = fVar34 * local_168._4_4_;
          auVar65._8_4_ = fVar34 * local_168._8_4_;
          auVar65._12_4_ = fVar34 * local_168._12_4_;
          auVar67 = vfmadd231ps_fma(auVar65,local_148,auVar42);
          auVar31 = vmaxss_avx(ZEXT416((uint)(fVar46 - fVar37)),ZEXT816(0) << 0x40);
          fVar34 = auVar31._0_4_;
          fVar35 = 1.0 - fVar34;
          auVar48._0_4_ = fVar34 * local_158.m128[0];
          auVar48._4_4_ = fVar34 * local_158.m128[1];
          auVar48._8_4_ = fVar34 * local_158.m128[2];
          auVar48._12_4_ = fVar34 * local_158.m128[3];
          auVar43._4_4_ = fVar35;
          auVar43._0_4_ = fVar35;
          auVar43._8_4_ = fVar35;
          auVar43._12_4_ = fVar35;
          auVar50 = vfmadd231ps_fma(auVar48,auVar43,(undefined1  [16])local_178);
          auVar52._0_4_ = fVar34 * local_148._0_4_;
          auVar52._4_4_ = fVar34 * local_148._4_4_;
          auVar52._8_4_ = fVar34 * local_148._8_4_;
          auVar52._12_4_ = fVar34 * local_148._12_4_;
          auVar54 = vfmadd231ps_fma(auVar52,auVar43,local_168);
        }
        else {
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_58.field_1,&local_188,(long)(iVar23 + 1));
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_78.field_1,&local_188,(long)((int)fVar46 + -1));
          auVar30 = auVar80._0_16_;
          auVar31 = vmaxss_avx(ZEXT416((uint)fVar34),ZEXT816(0) << 0x40);
          fVar36 = auVar31._0_4_;
          auVar61._0_4_ = fVar36 * local_58.m128[0];
          auVar61._4_4_ = fVar36 * local_58.m128[1];
          auVar61._8_4_ = fVar36 * local_58.m128[2];
          auVar61._12_4_ = fVar36 * local_58.m128[3];
          fVar34 = 1.0 - fVar36;
          auVar38._4_4_ = fVar34;
          auVar38._0_4_ = fVar34;
          auVar38._8_4_ = fVar34;
          auVar38._12_4_ = fVar34;
          auVar62 = vfmadd231ps_fma(auVar61,auVar38,(undefined1  [16])local_158);
          auVar66._0_4_ = fVar36 * local_48;
          auVar66._4_4_ = fVar36 * fStack_44;
          auVar66._8_4_ = fVar36 * fStack_40;
          auVar66._12_4_ = fVar36 * fStack_3c;
          auVar67 = vfmadd231ps_fma(auVar66,auVar38,local_148);
          auVar31 = vmaxss_avx(ZEXT416((uint)(fVar46 - fVar37)),ZEXT816(0) << 0x40);
          fVar37 = auVar31._0_4_;
          fVar34 = 1.0 - fVar37;
          auVar49._0_4_ = fVar37 * local_78.m128[0];
          auVar49._4_4_ = fVar37 * local_78.m128[1];
          auVar49._8_4_ = fVar37 * local_78.m128[2];
          auVar49._12_4_ = fVar37 * local_78.m128[3];
          auVar44._4_4_ = fVar34;
          auVar44._0_4_ = fVar34;
          auVar44._8_4_ = fVar34;
          auVar44._12_4_ = fVar34;
          auVar50 = vfmadd231ps_fma(auVar49,auVar44,(undefined1  [16])local_178);
          auVar53._0_4_ = fVar37 * local_68;
          auVar53._4_4_ = fVar37 * fStack_64;
          auVar53._8_4_ = fVar37 * fStack_60;
          auVar53._12_4_ = fVar37 * fStack_5c;
          auVar54 = vfmadd231ps_fma(auVar53,auVar44,local_168);
          if ((int)(uVar15 + 1) < iVar27) {
            sVar18 = (size_t)(uVar15 + 1);
            iVar27 = ~uVar15 + iVar27;
            do {
              fVar37 = ((float)(int)sVar18 / fVar1 - fVar41) / (fVar35 - fVar41);
              fVar34 = 1.0 - fVar37;
              auVar47._0_4_ = auVar50._0_4_ * fVar37;
              fVar46 = auVar50._4_4_;
              auVar47._4_4_ = fVar46 * fVar37;
              fVar36 = auVar50._8_4_;
              auVar47._8_4_ = fVar36 * fVar37;
              fVar51 = auVar50._12_4_;
              auVar47._12_4_ = fVar51 * fVar37;
              auVar45._4_4_ = fVar34;
              auVar45._0_4_ = fVar34;
              auVar45._8_4_ = fVar34;
              auVar45._12_4_ = fVar34;
              auVar31 = vfmadd231ps_fma(auVar47,auVar45,auVar62);
              auVar39._0_4_ = auVar54._0_4_ * fVar37;
              fVar34 = auVar54._4_4_;
              auVar39._4_4_ = fVar34 * fVar37;
              fVar57 = auVar54._8_4_;
              auVar39._8_4_ = fVar57 * fVar37;
              fVar58 = auVar54._12_4_;
              auVar39._12_4_ = fVar58 * fVar37;
              local_a8 = vfmadd231ps_fma(auVar39,auVar67,auVar45);
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_98.field_1,&local_188,sVar18);
              auVar30 = auVar80._0_16_;
              local_1d8 = auVar67._0_4_;
              fStack_1d4 = auVar67._4_4_;
              fStack_1d0 = auVar67._8_4_;
              fStack_1cc = auVar67._12_4_;
              local_238 = auVar62._0_4_;
              fStack_234 = auVar62._4_4_;
              fStack_230 = auVar62._8_4_;
              fStack_22c = auVar62._12_4_;
              auVar31 = vsubps_avx((undefined1  [16])local_98,auVar31);
              auVar33 = vsubps_avx(local_88,local_a8);
              auVar32 = vminps_avx(auVar31,ZEXT816(0) << 0x40);
              auVar31 = vmaxps_avx(auVar33,ZEXT816(0) << 0x40);
              auVar62._0_4_ = local_238 + auVar32._0_4_;
              auVar62._4_4_ = fStack_234 + auVar32._4_4_;
              auVar62._8_4_ = fStack_230 + auVar32._8_4_;
              auVar62._12_4_ = fStack_22c + auVar32._12_4_;
              auVar50._0_4_ = auVar50._0_4_ + auVar32._0_4_;
              auVar50._4_4_ = fVar46 + auVar32._4_4_;
              auVar50._8_4_ = fVar36 + auVar32._8_4_;
              auVar50._12_4_ = fVar51 + auVar32._12_4_;
              auVar67._0_4_ = local_1d8 + auVar31._0_4_;
              auVar67._4_4_ = fStack_1d4 + auVar31._4_4_;
              auVar67._8_4_ = fStack_1d0 + auVar31._8_4_;
              auVar67._12_4_ = fStack_1cc + auVar31._12_4_;
              auVar54._0_4_ = auVar54._0_4_ + auVar31._0_4_;
              auVar54._4_4_ = fVar34 + auVar31._4_4_;
              auVar54._8_4_ = fVar57 + auVar31._8_4_;
              auVar54._12_4_ = fVar58 + auVar31._12_4_;
              sVar18 = sVar18 + 1;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
          }
        }
        auVar30 = vxorps_avx512vl(auVar30,auVar30);
        auVar80 = ZEXT1664(auVar30);
        aVar9 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar62,ZEXT416(geomID),0x30);
        uVar15 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 super_Geometry.numTimeSteps - 1;
        uVar19 = (ulong)uVar15;
        BVar2 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        auVar40._8_8_ = 0;
        auVar40._0_4_ = BVar2.lower;
        auVar40._4_4_ = BVar2.upper;
        aVar10 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                 vinsertps_avx(auVar67,ZEXT416((uint)uVar26),0x30);
        aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar50,ZEXT416(uVar15),0x30);
        aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar54,ZEXT416(uVar15),0x30);
        auVar63._8_4_ = 0x3f000000;
        auVar63._0_8_ = 0x3f0000003f000000;
        auVar63._12_4_ = 0x3f000000;
        auVar55._0_4_ = aVar11.x * 0.5;
        auVar55._4_4_ = aVar11.y * 0.5;
        auVar55._8_4_ = aVar11.z * 0.5;
        auVar55._12_4_ = aVar11.field_3.w * 0.5;
        auVar30 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar9,auVar63);
        auVar59._0_4_ = aVar12.x * 0.5;
        auVar59._4_4_ = aVar12.y * 0.5;
        auVar59._8_4_ = aVar12.z * 0.5;
        auVar59._12_4_ = aVar12.field_3.w * 0.5;
        auVar31 = vfmadd231ps_fma(auVar59,(undefined1  [16])aVar10,auVar63);
        auVar56._0_4_ = auVar30._0_4_ + auVar31._0_4_;
        auVar56._4_4_ = auVar30._4_4_ + auVar31._4_4_;
        auVar56._8_4_ = auVar30._8_4_ + auVar31._8_4_;
        auVar56._12_4_ = auVar30._12_4_ + auVar31._12_4_;
        auVar30 = vminps_avx(local_d8,(undefined1  [16])aVar9);
        auVar69 = ZEXT1664(auVar30);
        auVar30 = vmaxps_avx(local_c8,(undefined1  [16])aVar10);
        auVar68 = ZEXT1664(auVar30);
        auVar30 = vminps_avx(local_138,(undefined1  [16])aVar11);
        auVar79 = ZEXT1664(auVar30);
        auVar30 = vmaxps_avx(local_128,(undefined1  [16])aVar12);
        auVar77 = ZEXT1664(auVar30);
        auVar30 = vminps_avx(local_e8,auVar56);
        auVar72 = ZEXT1664(auVar30);
        auVar30 = vmaxps_avx(local_108,auVar56);
        auVar75 = ZEXT1664(auVar30);
        uVar16 = vcmpps_avx512vl(local_b8,auVar40,1);
        auVar31 = vinsertps_avx(local_b8,auVar40,0x50);
        auVar30 = vblendps_avx(auVar40,local_b8,2);
        bVar29 = (bool)((byte)uVar16 & 1);
        bVar6 = (bool)((byte)(uVar16 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar64 = ZEXT1664(CONCAT412((uint)bVar8 * auVar31._12_4_ | (uint)!bVar8 * auVar30._12_4_,
                                     CONCAT48((uint)bVar7 * auVar31._8_4_ |
                                              (uint)!bVar7 * auVar30._8_4_,
                                              CONCAT44((uint)bVar6 * auVar31._4_4_ |
                                                       (uint)!bVar6 * auVar30._4_4_,
                                                       (uint)bVar29 * auVar31._0_4_ |
                                                       (uint)!bVar29 * auVar30._0_4_))));
        local_1f0 = local_1f0 + 1;
        local_1e8 = local_1e8 + uVar19;
        bVar29 = local_218 < uVar19;
        auVar30 = vmovshdup_avx(auVar40);
        local_118 = (float)((uint)bVar29 * auVar30._0_4_ + (uint)!bVar29 * (int)local_118);
        local_f8 = (float)((uint)bVar29 * (int)BVar2.lower + (uint)!bVar29 * (int)local_f8);
        if (local_218 <= uVar19) {
          local_218 = uVar19;
        }
        pPVar5 = prims->items;
        pPVar5[local_1e0].lbounds.bounds0.lower.field_0 = aVar9;
        pPVar5[local_1e0].lbounds.bounds0.upper.field_0 = aVar10;
        pPVar5[local_1e0].lbounds.bounds1.lower.field_0.field_1 = aVar11;
        pPVar5[local_1e0].lbounds.bounds1.upper.field_0.field_1 = aVar12;
        pPVar5[local_1e0].time_range = BVar2;
        uVar21 = r->_end;
        auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar81 = ZEXT1664(auVar30);
        auVar30 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
        auVar82 = ZEXT1664(auVar30);
        auVar30 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
        auVar83 = ZEXT1664(auVar30);
        local_1e0 = local_1e0 + 1;
      }
LAB_01ede186:
      auVar30 = auVar64._0_16_;
      aVar73 = auVar68._0_16_;
      aVar70 = auVar69._0_16_;
      uVar26 = uVar26 + 1;
    } while (uVar26 < uVar21);
    (__return_storage_ptr__->object_range)._end = local_1f0;
    aVar78 = auVar79._0_16_;
    aVar76 = auVar77._0_16_;
    aVar71 = auVar72._0_16_;
    aVar74 = auVar75._0_16_;
  }
  else {
    auVar30 = SUB6416(ZEXT464(0x3f800000),0);
    aVar70.m128[2] = INFINITY;
    aVar70._0_8_ = 0x7f8000007f800000;
    aVar70.m128[3] = INFINITY;
    aVar73.m128[2] = -INFINITY;
    aVar73._0_8_ = 0xff800000ff800000;
    aVar73.m128[3] = -INFINITY;
    local_f8 = 0.0;
    local_118 = 1.0;
    local_218 = 0;
    local_1e8 = 0;
    aVar78 = aVar70;
    aVar76 = aVar73;
    aVar71 = aVar70;
    aVar74 = aVar73;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar70;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar73;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar78;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar76;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar71;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar74;
  BVar2 = (BBox1f)vmovlps_avx(auVar30);
  __return_storage_ptr__->time_range = BVar2;
  __return_storage_ptr__->num_time_segments = local_1e8;
  __return_storage_ptr__->max_num_time_segments = local_218;
  (__return_storage_ptr__->max_time_range).lower = local_f8;
  (__return_storage_ptr__->max_time_range).upper = local_118;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }